

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio.c
# Opt level: O0

void audio_callback(void *userdata,Uint8 *stream,int length)

{
  ulong uVar1;
  int i;
  float *out;
  gba_apu_t *apu;
  int length_local;
  Uint8 *stream_local;
  void *userdata_local;
  
  out = (float *)stream;
  for (i = 0; (ulong)(long)i < (ulong)(long)length >> 2; i = i + 1) {
    if (*(ulong *)((long)userdata + 0x4070) < *(ulong *)((long)userdata + 0x4078)) {
      uVar1 = *(ulong *)((long)userdata + 0x4070);
      *(ulong *)((long)userdata + 0x4070) = uVar1 + 1;
      *(undefined4 *)((long)userdata + 0x408c) =
           *(undefined4 *)((long)userdata + (uVar1 & 0xfff) * 4 + 0x70);
    }
    *out = *(float *)((long)userdata + 0x408c);
    out = out + 1;
  }
  return;
}

Assistant:

void audio_callback(void* userdata, Uint8* stream, int length) {
    gba_apu_t* apu = (gba_apu_t*)userdata;
    float* out = (float*)stream;
    for (int i = 0; i < length / sizeof(float); i++) {
        if (apu->bigbuffer.read_index < apu->bigbuffer.write_index) {
            apu->apu_last_sample = apu->bigbuffer.buf[(apu->bigbuffer.read_index++) % AUDIO_BIGBUFFER_SIZE];
        }
        *out++ = apu->apu_last_sample;
    }
}